

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mysimulator.cc
# Opt level: O2

void __thiscall brown::MySimulator::moveLinear(MySimulator *this,int dx,int dy,bool isDown)

{
  uint uVar1;
  _Deque_base<long,_std::allocator<long>_> *p_Var2;
  MySimulator *pMVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  size_type sVar8;
  _Deque_base<long,_std::allocator<long>_> *p_Var9;
  _Elt_pointer plVar10;
  int64_t iVar11;
  bool pulx;
  uint uVar12;
  int iVar13;
  value_type vVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  long tt;
  int iVar18;
  long lVar19;
  stack<long,_std::deque<long,_std::allocator<long>_>_> vt1s;
  stack<long,_std::deque<long,_std::allocator<long>_>_> vt2s;
  value_type local_118;
  float local_110;
  uint local_10c;
  int local_108;
  int local_104;
  MySimulator *local_100;
  int local_f4;
  uint local_f0;
  uint local_ec;
  _Deque_base<long,_std::allocator<long>_> *local_e8;
  iterator *local_e0;
  int64_t local_d8;
  _Deque_base<long,_std::allocator<long>_> local_d0;
  _Deque_base<long,_std::allocator<long>_> local_80;
  long lVar7;
  
  if (dy != 0 || dx != 0) {
    local_ec = -dx;
    if (0 < dx) {
      local_ec = dx;
    }
    local_f0 = -dy;
    if (0 < dy) {
      local_f0 = dy;
    }
    uVar12 = local_f0;
    if (local_f0 < local_ec) {
      uVar12 = local_ec;
    }
    uVar1 = local_f0;
    if (local_ec < local_f0) {
      uVar1 = local_ec;
    }
    iVar5 = (this->super_Simulator).PULPERPIX;
    iVar13 = uVar12 * iVar5;
    iVar5 = iVar5 * uVar1;
    if (uVar1 == 0) {
      local_110 = -1.0;
    }
    else {
      local_110 = (float)iVar13 / (float)iVar5;
    }
    local_d8 = this->clk;
    local_108 = dy;
    local_104 = dx;
    local_100 = this;
    std::stack<long,std::deque<long,std::allocator<long>>>::
    stack<std::deque<long,std::allocator<long>>,void>
              ((stack<long,_std::deque<long,_std::allocator<long>_>_> *)&local_d0);
    std::stack<long,std::deque<long,std::allocator<long>>>::
    stack<std::deque<long,std::allocator<long>>,void>
              ((stack<long,_std::deque<long,_std::allocator<long>_>_> *)&local_80);
    lVar19 = 0;
    if (uVar1 == 0) {
      lVar19 = 0x7fffffffffffffff;
    }
    local_10c = (uint)isDown;
    iVar15 = 0;
    iVar16 = 0;
    lVar4 = 0;
LAB_00105309:
    while ((lVar7 = lVar4, lVar6 = lVar19, iVar16 < iVar13 || (iVar15 < iVar5))) {
      tt = lVar6;
      if (lVar7 < lVar6) {
        tt = lVar7;
      }
      pulx = lVar7 <= lVar6 != local_ec <= local_f0;
      local_100->clk = local_d8 + tt;
      Simulator::setpin(&local_100->super_Simulator,local_d8 + tt,pulx,!pulx,0 < local_104,
                        0 < local_108,SUB41(local_10c,0));
      iVar18 = iVar15;
      if (lVar7 <= lVar6) {
        iVar18 = iVar16;
      }
      iVar18 = iVar18 + 1;
      if (lVar7 <= lVar6) goto LAB_001053cc;
      lVar19 = 0x7fffffffffffffff;
      iVar15 = iVar18;
      lVar4 = lVar7;
      if (iVar18 < iVar5) {
        iVar17 = iVar5;
        if (lVar7 <= lVar6) {
          iVar17 = iVar13;
        }
        p_Var9 = &local_80;
        if (lVar7 <= lVar6) {
          p_Var9 = &local_d0;
        }
        p_Var2 = &local_80;
        goto LAB_001053f2;
      }
    }
    lVar19 = (long)(local_100->super_Simulator).MAXT + local_100->clk;
    local_100->clk = lVar19;
    Simulator::setpin(&local_100->super_Simulator,lVar19,false,false,0 < local_104,0 < local_108,
                      SUB41(local_10c,0));
    std::_Deque_base<long,_std::allocator<long>_>::~_Deque_base(&local_80);
    std::_Deque_base<long,_std::allocator<long>_>::~_Deque_base(&local_d0);
  }
  return;
LAB_001053cc:
  p_Var9 = &local_d0;
  p_Var2 = &local_d0;
  lVar19 = lVar6;
  iVar16 = iVar18;
  iVar17 = iVar13;
  lVar4 = 0x7fffffffffffffff;
  if (iVar13 <= iVar18) goto LAB_00105309;
LAB_001053f2:
  local_e0 = &(p_Var2->_M_impl).super__Deque_impl_data._M_finish;
  local_118 = 0;
  local_f4 = iVar17;
  local_e8 = p_Var9;
  sVar8 = std::deque<long,_std::allocator<long>_>::size
                    ((deque<long,_std::allocator<long>_> *)p_Var9);
  pMVar3 = local_100;
  if (sVar8 < (ulong)(long)(local_f4 - iVar18)) {
    p_Var9 = &local_80;
    if (lVar7 <= lVar6) {
      p_Var9 = &local_d0;
    }
    plVar10 = local_e0->_M_cur;
    if (plVar10 != (p_Var9->_M_impl).super__Deque_impl_data._M_start._M_cur) {
      p_Var9 = &local_80;
      if (lVar7 <= lVar6) {
        p_Var9 = &local_d0;
      }
      if (plVar10 == (p_Var9->_M_impl).super__Deque_impl_data._M_finish._M_first) {
        p_Var9 = &local_80;
        if (lVar7 <= lVar6) {
          p_Var9 = &local_d0;
        }
        plVar10 = (p_Var9->_M_impl).super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      vVar14 = (value_type)(local_100->super_Simulator).MINT;
      if (plVar10[-1] <= vVar14) goto LAB_00105523;
    }
    iVar11 = linearSpeedCurve(local_100,tt);
    local_118 = (value_type)(pMVar3->super_Simulator).MINT;
    if (local_118 < iVar11) {
      local_118 = iVar11;
    }
    std::deque<long,_std::allocator<long>_>::push_back
              ((deque<long,_std::allocator<long>_> *)local_e8,&local_118);
    vVar14 = local_118;
  }
  else {
    plVar10 = local_e0->_M_cur;
    p_Var9 = &local_80;
    if (lVar7 <= lVar6) {
      p_Var9 = &local_d0;
    }
    if (plVar10 == (p_Var9->_M_impl).super__Deque_impl_data._M_finish._M_first) {
      p_Var9 = &local_80;
      if (lVar7 <= lVar6) {
        p_Var9 = &local_d0;
      }
      plVar10 = (p_Var9->_M_impl).super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    local_118 = plVar10[-1];
    std::deque<long,_std::allocator<long>_>::pop_back
              ((deque<long,_std::allocator<long>_> *)local_e8);
    vVar14 = local_118;
  }
LAB_00105523:
  local_118 = vVar14;
  if (lVar6 < lVar7) {
    lVar19 = lVar6 + (long)((float)local_118 * local_110);
    lVar4 = lVar7;
  }
  else {
    lVar19 = lVar6;
    lVar4 = local_118 + lVar7;
  }
  goto LAB_00105309;
}

Assistant:

void MySimulator::moveLinear(int dx, int dy, bool isDown) {
    if (dx == 0 && dy == 0) {
        return;
    }

    // direction and displacement
    bool dirx = (dx > 0);
    bool diry = (dy > 0);
    dx = std::abs(dx);
    dy = std::abs(dy);

    // determine primary/long and secondary/short axis
    bool isxmain = (dx > dy);
    int d1px = (isxmain ? dx : dy);
    int d2px = (isxmain ? dy : dx);
    bool d2is0 = (d2px == 0);

    // target steps and ratio
    int d1step = d1px * PULPERPIX;
    int d2step = d2px * PULPERPIX;
    float tg = d2is0? -1 : static_cast<float>(d1step)/d2step;

    // step keeping
    int s1 = 0;
    int s2 = 0;

    // time keeping
    std::int64_t startTick = clk;
    std::int64_t t1 = 0;
    std::int64_t t2 = d2is0 ? std::numeric_limits<std::int64_t>::max() : 0;

    // speed history
    std::stack<std::int64_t> vt1s;
    std::stack<std::int64_t> vt2s;

    while ((s1 < d1step) || (s2 < d2step)) {
        // determine driving axis
        bool ismain = (t1 <= t2);
        int& s = ismain ? s1 : s2;
        int dstep = ismain ? d1step : d2step;
        bool isx = (ismain == isxmain);
        std::int64_t& t = ismain ? t1 : t2;
        std::stack<std::int64_t>& vts = ismain ? vt1s : vt2s;

        // step
        clk = startTick + t;
        setpin(clk, isx, !isx, dirx, diry, isDown);
        if (++s >= dstep) {
            t = std::numeric_limits<std::int64_t>::max();
            continue;
        }

        // set next step interval
        std::int64_t vt = 0;
        if (vts.size() >= (dstep - s)) { // decelerate
            vt = vts.top();
            vts.pop();
        } else if (vts.empty() || (vts.top() > MINT)) { // accelerate
            vt = linearSpeedCurve(t);
            if (vt < MINT) { // speeding
                vt = MINT;
            }
            vts.push(vt);
        } else { // hold
            vt = MINT;
        }

        // adjust speed on secondary axis
        if (!ismain) {
            vt *= tg;
        }
        t += vt;
    }

    // delay, a time gap between line drawings
    clk += MAXT;
    setpin(clk, false, false, dirx, diry, isDown);
}